

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParmParse.cpp
# Opt level: O3

void amrex::ParmParse::dumpTable(ostream *os,bool prettyPrint)

{
  ostream *poVar1;
  undefined8 *puVar2;
  string local_50;
  
  if ((undefined8 **)(anonymous_namespace)::g_table_abi_cxx11_ !=
      &(anonymous_namespace)::g_table_abi_cxx11_) {
    puVar2 = (anonymous_namespace)::g_table_abi_cxx11_;
    do {
      if ((prettyPrint) && (*(char *)(puVar2 + 10) == '\x01')) {
        PP_entry::print_abi_cxx11_(&local_50,(PP_entry *)(puVar2 + 2));
        poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                           (os,local_50._M_dataplus._M_p,local_50._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
        std::ostream::put((char)poVar1);
        std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        amrex::operator<<(os,(PP_entry *)(puVar2 + 2));
        std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + (char)os);
        std::ostream::put((char)os);
        std::ostream::flush();
      }
      puVar2 = (undefined8 *)*puVar2;
    } while ((undefined8 **)puVar2 != &(anonymous_namespace)::g_table_abi_cxx11_);
  }
  return;
}

Assistant:

void
ParmParse::dumpTable (std::ostream& os, bool prettyPrint)
{
    for ( const_list_iterator li = g_table.begin(), End = g_table.end(); li != End; ++li )
    {
        if(prettyPrint && li->m_queried) {
            os << li->print() << std::endl;
        }
        else
            os << *li << std::endl;
    }
}